

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall
r_comp::Compiler::set
          (Compiler *this,Ptr *node,Class *p,uint16_t write_index,uint16_t *extent_index,bool write)

{
  ushort uVar1;
  ImageObject *pIVar2;
  pointer psVar3;
  pointer pcVar4;
  element_type *peVar5;
  short sVar6;
  short sVar7;
  bool bVar8;
  char cVar9;
  byte bVar10;
  ushort uVar11;
  int iVar12;
  Atom *pAVar13;
  long *plVar14;
  pointer psVar15;
  ssize_t sVar16;
  long *plVar17;
  size_type *psVar18;
  ulong uVar19;
  element_type *peVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined7 in_register_00000089;
  uint16_t *extent_index_00;
  uint uVar24;
  long lVar25;
  Class _p;
  string label;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  undefined1 local_160 [24];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_148;
  ulong local_130;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *local_128;
  Ptr local_120;
  Ptr local_110;
  undefined8 local_100;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  Ptr local_f0;
  Ptr local_e0;
  Ptr local_d0;
  Ptr local_c0;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  char *local_50 [2];
  char local_40 [16];
  
  extent_index_00 = (uint16_t *)CONCAT71(in_register_00000089,write);
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  iVar12 = std::__cxx11::string::compare
                     ((char *)&((node->
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->label);
  if (iVar12 == 0) {
LAB_0012a2eb:
    if (write) {
      r_code::Atom::IPointer((ushort)local_170);
      pAVar13 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
      r_code::Atom::operator=(pAVar13,(Atom *)local_170);
      r_code::Atom::~Atom((Atom *)local_170);
      cVar9 = r_code::Atom::getDescriptor();
      if ((cVar9 == -0x3e) && (p->use_as != I_SET)) {
        uVar11 = r_code::Atom::getAtomCount();
        pIVar2 = this->current_object;
        uVar1 = *extent_index;
        *extent_index = uVar1 + 1;
        pAVar13 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
        r_code::Atom::operator=(pAVar13,&p->atom);
      }
      else {
        peVar20 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        uVar11 = (ushort)((ulong)((long)(peVar20->args).
                                        super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(peVar20->args).
                                       super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
        r_code::Atom::Set((uchar)local_170);
        pIVar2 = this->current_object;
        uVar1 = *extent_index;
        *extent_index = uVar1 + 1;
        pAVar13 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar1);
        r_code::Atom::operator=(pAVar13,(Atom *)local_170);
        r_code::Atom::~Atom((Atom *)local_170);
      }
      uVar21 = (uint)*extent_index;
      *extent_index = (uVar11 & 0xff) + *extent_index;
    }
    else {
      uVar21 = 0;
    }
    uVar23 = 0xffffffff;
    if (p->use_as == I_CLASS) {
      bVar10 = r_code::Atom::getAtomCount();
      uVar23 = (ulong)bVar10;
      if (write) {
        if (bVar10 == 0) {
          uVar23 = 0;
        }
        else {
          uVar24 = uVar21;
          do {
            r_code::Atom::Wildcard((ushort)(Atom *)local_170);
            pAVar13 = r_code::vector<r_code::Atom>::operator[]
                                ((vector<r_code::Atom> *)(this->current_object + 8),
                                 (ulong)uVar24 & 0xffff);
            r_code::Atom::operator=(pAVar13,(Atom *)local_170);
            r_code::Atom::~Atom((Atom *)local_170);
            uVar24 = uVar24 + 1;
          } while ((uVar24 & 0xffff) < uVar21 + bVar10);
        }
      }
    }
    peVar20 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar15 = (peVar20->args).
              super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (peVar20->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((int)uVar23 != -1) && (uVar19 = (long)psVar3 - (long)psVar15, (long)uVar19 >> 4 != uVar23))
    {
      if ((this->state).no_arity_check != true) {
        local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
            peVar5 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            uVar19 = (long)(peVar5->args).
                           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(peVar5->args).
                           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar20;
        set_arity_error(this,&local_d0,(uint16_t)uVar23,(uint16_t)(uVar19 >> 4));
        if (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        goto LAB_0012aa75;
      }
      (this->state).no_arity_check = false;
    }
    bVar8 = true;
    if (psVar3 != psVar15) {
      local_128 = &p->things_to_read;
      lVar25 = 8;
      lVar22 = 0;
      uVar23 = 0;
      do {
        sVar7 = (short)uVar23;
        sVar6 = (short)uVar21;
        switch(p->use_as) {
        case I_CLASS:
          local_100 = *(undefined8 *)((long)psVar15 + lVar25 + -8);
          local_f8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                      ((long)&(psVar15->
                              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + lVar25);
          if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_f8->_M_use_count = local_f8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_f8->_M_use_count = local_f8->_M_use_count + 1;
            }
          }
          extent_index_00 = extent_index;
          sVar16 = read(this,(int)&local_100,
                        (void *)((long)&((local_128->
                                         super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_read + lVar22
                                ),1);
          cVar9 = (char)sVar16;
          this_00._M_pi = local_f8;
          break;
        case I_EXPRESSION:
          local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)((long)psVar15 + lVar25 + -8);
          local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar15->
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar25);
          if (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          extent_index_00 = extent_index;
          cVar9 = read_expression(this,&local_e0,true,p,sVar6 + sVar7,extent_index,write);
          this_00._M_pi =
               local_e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          break;
        case I_SET:
          local_170._0_4_ = *(undefined4 *)p;
          local_168._M_p = local_160 + 8;
          pcVar4 = (p->str_opcode)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,pcVar4,pcVar4 + (p->str_opcode)._M_string_length);
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                    (&local_148,local_128);
          local_130._0_4_ = p->type;
          local_130._4_4_ = p->use_as;
          local_130 = local_130 & 0xffffffff;
          psVar15 = (((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->args).
                    super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)((long)psVar15 + lVar25 + -8);
          local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&psVar15->
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> +
                   lVar25);
          if (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          extent_index_00 = extent_index;
          cVar9 = read_set(this,&local_f0,true,(Class *)local_170,sVar6 + sVar7,extent_index,write);
          if (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                    (&local_148);
          if (local_168._M_p != local_160 + 8) {
            operator_delete(local_168._M_p);
          }
          r_code::Atom::~Atom((Atom *)local_170);
          goto LAB_0012a92a;
        case I_DCLASS:
          local_110.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)((long)psVar15 + lVar25 + -8);
          local_110.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar15->
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar25);
          peVar20 = local_110.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          if (local_110.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            peVar20 = (element_type *)&__libc_single_threaded;
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_110.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_110.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_110.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_110.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          cVar9 = read_class(this,&local_110,false,(Class *)peVar20,sVar6 + sVar7,extent_index_00,
                             write);
          this_00._M_pi =
               local_110.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          break;
        default:
          goto switchD_0012a6ba_default;
        }
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
LAB_0012a92a:
        if (cVar9 == '\0') {
          local_170 = (undefined1  [8])local_160;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_170," error: illegal element in set","");
          local_120.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_120.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_120.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_120.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_120.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_120.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_120.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          set_error(this,(string *)local_170,&local_120);
          if (local_120.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_120.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          local_50[0] = (char *)local_170;
          if (local_170 == (undefined1  [8])local_160) goto LAB_0012aa75;
          goto LAB_0012aa70;
        }
switchD_0012a6ba_default:
        uVar23 = uVar23 + 1;
        peVar20 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        psVar15 = (peVar20->args).
                  super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar25 = lVar25 + 0x10;
        lVar22 = lVar22 + 0x60;
      } while (uVar23 < (ulong)((long)(peVar20->args).
                                      super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar15 >>
                               4));
      bVar8 = true;
    }
  }
  else {
    std::__cxx11::string::substr
              ((ulong)local_170,
               (ulong)&((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->label);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)local_170);
    if (local_170 != (undefined1  [8])local_160) {
      operator_delete((void *)local_170);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_b0,local_b0 + local_a8);
    bVar8 = addLocalReference(this,&local_70,write_index,p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (bVar8) goto LAB_0012a2eb;
    std::__cxx11::string::find((char *)&local_b0,0x13e7df,0);
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b0);
    plVar14 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x13e7d6);
    plVar17 = plVar14 + 2;
    if ((long *)*plVar14 == plVar17) {
      local_80 = *plVar17;
      lStack_78 = plVar14[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar17;
      local_90 = (long *)*plVar14;
    }
    local_88 = plVar14[1];
    *plVar14 = (long)plVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_90);
    psVar18 = (size_type *)(plVar14 + 2);
    if ((size_type *)*plVar14 == psVar18) {
      local_160._0_8_ = *psVar18;
      local_160._8_8_ = plVar14[3];
      local_170 = (undefined1  [8])local_160;
    }
    else {
      local_160._0_8_ = *psVar18;
      local_170 = (undefined1  [8])*plVar14;
    }
    local_168._M_p = (pointer)plVar14[1];
    *plVar14 = (long)psVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    set_error(this,(string *)local_170,&local_c0);
    if (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_170 != (undefined1  [8])local_160) {
      operator_delete((void *)local_170);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_50[0] != local_40) {
LAB_0012aa70:
      operator_delete(local_50[0]);
    }
LAB_0012aa75:
    bVar8 = false;
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return bVar8;
}

Assistant:

bool Compiler::set(RepliStruct::Ptr node, const Class &p, uint16_t write_index, uint16_t &extent_index, bool write)
{
    bool lbl = false;
    std::string label;

    if (node->label != "") {
        label = node->label.substr(0, node->label.size() - 1);
        lbl = true;
    }

    if (lbl) {
        if (!addLocalReference(label, write_index, p)) {
            set_error("cast to " + label.substr(label.find("#") + 1) + ": unknown class", node);
            return false;
        }
    }

    uint16_t content_write_index = 0;

    if (write) {
        current_object->code[write_index] = Atom::IPointer(extent_index);
        uint8_t element_count;

        if (p.atom.getDescriptor() == Atom::S_SET && p.use_as != StructureMember::I_SET) {
            element_count = p.atom.getAtomCount();
            current_object->code[extent_index++] = p.atom;
        } else {
            element_count = node->args.size();//set_element_count(node);
            current_object->code[extent_index++] = Atom::Set(element_count);
        }

        content_write_index = extent_index;
        extent_index += element_count;
    }

    uint32_t arity = UINT32_MAX;

    if (p.use_as == StructureMember::I_CLASS) { // undefined arity for unstructured sets.
        arity = p.atom.getAtomCount();

        if (write) // fill up with wildcards that will be overwritten up to ::.
            for (uint16_t j = content_write_index; j < content_write_index + arity; ++j) {
                current_object->code[j] = Atom::Wildcard();
            }
    }

    if (node->args.size() != arity && arity != UINT32_MAX) {
        if (state.no_arity_check) {
            state.no_arity_check = false;
        } else {
            set_arity_error(node, arity, node->args.size());
            return false;
        }
    }

    for (size_t i = 0; i < node->args.size(); i++) {
        bool r;

        switch (p.use_as) {
        case StructureMember::I_EXPRESSION:
            r = read_expression(node->args[i], true, &p, content_write_index + i, extent_index, write);
            break;

        case StructureMember::I_SET: {
            Class _p = p;
            _p.use_as = StructureMember::I_CLASS;
            r = read_set(node->args[i], true, &_p, content_write_index + i, extent_index, write);
            break;
        }

        case StructureMember::I_CLASS:
            r = read(node->args[i], p.things_to_read[i], true, content_write_index + i, extent_index, write);
            break;

        case StructureMember::I_DCLASS:
            r = read_class(node->args[i], true, nullptr, content_write_index + i, extent_index, write);
            break;
        }

        if (!r) {
            set_error(" error: illegal element in set", node);
            return false;
        }
    }

    return true;
}